

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

bool __thiscall
Rml::Element::StartTransition
          (Element *this,Transition *transition,Property *start_value,Property *target_value)

{
  PropertyId PVar1;
  long lVar2;
  ElementAnimation *pEVar3;
  const_iterator __position;
  long lVar4;
  bool bVar5;
  float fVar6;
  double dVar7;
  float local_84;
  ElementAnimation local_70;
  
  pEVar3 = (this->animations).
           super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>._M_impl
           .super__Vector_impl_data._M_start;
  __position._M_current =
       (this->animations).
       super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar2 = (long)__position._M_current - (long)pEVar3;
  PVar1 = transition->id;
  for (lVar4 = lVar2 >> 8; 0 < lVar4; lVar4 = lVar4 + -1) {
    if (pEVar3->property_id == PVar1) goto LAB_0028413d;
    if (pEVar3[1].property_id == PVar1) {
      pEVar3 = pEVar3 + 1;
      goto LAB_0028413d;
    }
    if (pEVar3[2].property_id == PVar1) {
      pEVar3 = pEVar3 + 2;
      goto LAB_0028413d;
    }
    if (pEVar3[3].property_id == PVar1) {
      pEVar3 = pEVar3 + 3;
      goto LAB_0028413d;
    }
    pEVar3 = pEVar3 + 4;
    lVar2 = lVar2 + -0x100;
  }
  lVar2 = lVar2 >> 6;
  if (lVar2 == 1) {
LAB_00284121:
    if (pEVar3->property_id != PVar1) {
      pEVar3 = __position._M_current;
    }
  }
  else if (lVar2 == 2) {
LAB_00284118:
    if (pEVar3->property_id != PVar1) {
      pEVar3 = pEVar3 + 1;
      goto LAB_00284121;
    }
  }
  else {
    if (lVar2 != 3) goto LAB_0028414c;
    if (pEVar3->property_id != PVar1) {
      pEVar3 = pEVar3 + 1;
      goto LAB_00284118;
    }
  }
LAB_0028413d:
  bVar5 = pEVar3 != __position._M_current;
  __position._M_current = pEVar3;
  if ((bVar5) && (pEVar3->origin != Transition)) {
    return false;
  }
LAB_0028414c:
  local_84 = transition->duration;
  dVar7 = Clock::GetElapsedTime();
  dVar7 = (double)transition->delay + dVar7;
  if (__position._M_current ==
      (this->animations).
      super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ElementAnimation::ElementAnimation
              (&local_70,transition->id,Transition,start_value,this,dVar7,0.0,1,false);
    ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::
    emplace_back<Rml::ElementAnimation>(&this->animations,&local_70);
    ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::~vector(&local_70.keys);
    __position._M_current =
         (this->animations).
         super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
  }
  else {
    fVar6 = ElementAnimation::GetInterpolationFactor(__position._M_current);
    local_84 = local_84 * (1.0 - (1.0 - fVar6) * transition->reverse_adjustment_factor);
    ElementAnimation::ElementAnimation
              (&local_70,transition->id,Transition,start_value,this,dVar7,0.0,1,false);
    ElementAnimation::operator=(__position._M_current,&local_70);
    ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::~vector(&local_70.keys);
  }
  bVar5 = ElementAnimation::AddKey
                    (__position._M_current,local_84,target_value,this,transition->tween,true);
  if (!bVar5) {
    ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::erase
              (&this->animations,__position);
    return false;
  }
  SetProperty(this,transition->id,start_value);
  return true;
}

Assistant:

bool Element::StartTransition(const Transition& transition, const Property& start_value, const Property& target_value)
{
	auto it = std::find_if(animations.begin(), animations.end(), [&](const ElementAnimation& el) { return el.GetPropertyId() == transition.id; });

	if (it != animations.end() && !it->IsTransition())
		return false;

	float duration = transition.duration;
	double start_time = Clock::GetElapsedTime() + (double)transition.delay;

	if (it == animations.end())
	{
		// Add transition as new animation
		animations.push_back(ElementAnimation{transition.id, ElementAnimationOrigin::Transition, start_value, *this, start_time, 0.0f, 1, false});
		it = (animations.end() - 1);
	}
	else
	{
		// Compress the duration based on the progress of the current animation
		float f = it->GetInterpolationFactor();
		f = 1.0f - (1.0f - f) * transition.reverse_adjustment_factor;
		duration = duration * f;
		// Replace old transition
		*it = ElementAnimation{transition.id, ElementAnimationOrigin::Transition, start_value, *this, start_time, 0.0f, 1, false};
	}

	bool result = it->AddKey(duration, target_value, *this, transition.tween, true);

	if (result)
		SetProperty(transition.id, start_value);
	else
		animations.erase(it);

	return result;
}